

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
          (BitTrie *this,UdpEntrySyntax *syntax,span<const_char,_18446744073709551615UL> inputs,
          char stateChar,PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *allocator,
          SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> *results)

{
  char *pcVar1;
  pointer ppBVar2;
  long lVar3;
  long lVar4;
  anon_class_16_2_af07dd90 handle;
  SmallVector<slang::ast::BitTrie_*,_5UL> nodes;
  BitTrie *local_90;
  anon_class_16_2_af07dd90 local_88;
  BitTrie *local_78;
  SmallVector<slang::ast::BitTrie_*,_5UL> local_70;
  
  local_88.primaryNode = &local_90;
  pcVar1 = local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.firstElement;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.len = 0;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.cap = 5;
  local_90 = this;
  local_88.allocator = allocator;
  local_78 = this;
  local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_ = (pointer)pcVar1;
  SmallVectorBase<slang::ast::BitTrie*>::emplace_back<slang::ast::BitTrie*>
            ((SmallVectorBase<slang::ast::BitTrie*> *)&local_70,&local_78);
  traverse<slang::ast::BitTrie,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_MemberSymbols_cpp:792:23)_&>
            (this,&local_70,inputs,stateChar,&local_88);
  ppBVar2 = local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_;
  if (local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.len != 0) {
    lVar4 = local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.len << 3;
    lVar3 = 0;
    do {
      if (*(long *)(*(long *)((long)ppBVar2 + lVar3) + 0x40) != 0) {
        SmallVectorBase<slang::syntax::UdpEntrySyntax_const*>::
        emplace_back<slang::syntax::UdpEntrySyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::UdpEntrySyntax_const*> *)results,
                   (UdpEntrySyntax **)(*(long *)((long)ppBVar2 + lVar3) + 0x40));
      }
      lVar3 = lVar3 + 8;
    } while (lVar4 != lVar3);
  }
  local_90->entry = syntax;
  if (local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_ != (pointer)pcVar1) {
    operator_delete(local_70.super_SmallVectorBase<slang::ast::BitTrie_*>.data_);
  }
  return;
}

Assistant:

void insert(const UdpEntrySyntax& syntax, std::span<const char> inputs, char stateChar,
                TAllocator& allocator, SmallVector<const UdpEntrySyntax*>& results) {
        BitTrie* primaryNode = this;
        auto handle = [&primaryNode, &allocator](const BitTrie& constNode,
                                                 SmallVector<BitTrie*>& nextNodes, int index,
                                                 bool primary) {
            // If we are handling a primary and the current node is also
            // the primary node we should allocate if missing, otherwise
            // we only add if it already exists.
            BitTrie& node = const_cast<BitTrie&>(constNode);
            if (primary && primaryNode == &node) {
                if (!node.children[index])
                    node.children[index] = allocator.emplace();
                primaryNode = node.children[index];
            }

            if (node.children[index])
                nextNodes.push_back(node.children[index]);
        };

        SmallVector<BitTrie*> nodes;
        nodes.push_back(this);
        traverse(nodes, inputs, stateChar, handle);

        for (auto node : nodes) {
            if (node->entry)
                results.push_back(node->entry);
        }

        // Store the provided row so as not to miss info in case of possible overlap.
        // If the primary->entry already has a value, then rewriting will not spoil
        // anything, since the rewriting will be to the equivalent grammar.
        primaryNode->entry = &syntax;
    }